

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

JitTypePropertyGuard * __thiscall Func::GetOrCreateSingleTypeGuard(Func *this,intptr_t typeAddr)

{
  int index;
  code *pcVar1;
  bool bVar2;
  Allocator *pAVar3;
  JitTypePropertyGuard *pJVar4;
  undefined4 *puVar5;
  TrackAllocData local_48;
  JitTypePropertyGuard *local_20;
  JitTypePropertyGuard *guard;
  intptr_t typeAddr_local;
  Func *this_local;
  
  guard = (JitTypePropertyGuard *)typeAddr;
  typeAddr_local = (intptr_t)this;
  EnsureSingleTypeGuards(this);
  local_20 = (JitTypePropertyGuard *)0x0;
  bVar2 = JsUtil::
          BaseDictionary<long,_Js::JitTypePropertyGuard_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValue<long>(this->singleTypeGuards,(long *)&guard,&local_20);
  if (bVar2) {
    pJVar4 = (JitTypePropertyGuard *)Js::JitTypePropertyGuard::GetTypeAddr(local_20);
    if (pJVar4 != guard) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x636,"(guard->GetTypeAddr() == typeAddr)",
                         "guard->GetTypeAddr() == typeAddr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  else {
    pAVar3 = GetNativeCodeDataAllocator(this);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_48,(type_info *)&Js::JitTypePropertyGuard::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
               ,0x631);
    pAVar3 = NativeCodeData::Allocator::TrackAllocInfo(pAVar3,&local_48);
    pJVar4 = (JitTypePropertyGuard *)
             new<NativeCodeData::AllocatorNoFixup<Js::JitTypePropertyGuard>>
                       (0x10,(AllocatorNoFixup<Js::JitTypePropertyGuard> *)pAVar3,0x559fa0);
    index = this->indexedPropertyGuardCount;
    this->indexedPropertyGuardCount = index + 1;
    Js::JitTypePropertyGuard::JitTypePropertyGuard(pJVar4,(intptr_t)guard,index);
    local_20 = pJVar4;
    JsUtil::
    BaseDictionary<long,_Js::JitTypePropertyGuard_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Add(this->singleTypeGuards,(long *)&guard,&local_20);
  }
  return local_20;
}

Assistant:

Js::JitTypePropertyGuard*
Func::GetOrCreateSingleTypeGuard(intptr_t typeAddr)
{
    EnsureSingleTypeGuards();

    Js::JitTypePropertyGuard* guard = nullptr;
    if (!this->singleTypeGuards->TryGetValue(typeAddr, &guard))
    {
        // Property guards are allocated by NativeCodeData::Allocator so that their lifetime extends as long as the EntryPointInfo is alive.
        guard = NativeCodeDataNewNoFixup(GetNativeCodeDataAllocator(), Js::JitTypePropertyGuard, typeAddr, this->indexedPropertyGuardCount++);
        this->singleTypeGuards->Add(typeAddr, guard);
    }
    else
    {
        Assert(guard->GetTypeAddr() == typeAddr);
    }

    return guard;
}